

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNCnst.cpp
# Opt level: O2

void __thiscall NaPNConstGen::set_const_value(NaPNConstGen *this,NaReal fConst)

{
  uint uVar1;
  NaReal *pNVar2;
  ulong uVar3;
  
  uVar1 = this->nOutDim;
  pNVar2 = this->fConstVal;
  for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
    pNVar2[uVar3] = fConst;
  }
  return;
}

Assistant:

void
NaPNConstGen::set_const_value (NaReal fConst)
{
    //!!!check_tunable();

    unsigned    i;
    for(i = 0; i < nOutDim; ++i){
        fConstVal[i] = fConst;
    }
}